

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

void par_shapes__trefoil(float *uv,float *xyz,void *userdata)

{
  float fVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  
  fVar13 = (1.0 - *uv) * 4.0 * 3.1415927;
  fVar1 = *userdata;
  fVar2 = uv[1];
  dVar3 = (double)(fVar13 * 1.5);
  dVar4 = cos(dVar3);
  dVar4 = (double)(float)(dVar4 * 0.30000001192092896 + 0.5);
  dVar5 = (double)fVar13;
  dVar6 = cos(dVar5);
  dVar7 = sin(dVar5);
  dVar8 = sin(dVar3);
  dVar9 = sin(dVar3);
  dVar10 = cos(dVar5);
  dVar11 = cos(dVar3);
  dVar12 = sin(dVar5);
  fVar13 = (float)(dVar10 * dVar9 * -0.45000001788139343 -
                  dVar12 * (dVar11 * 0.30000001192092896 + 0.5));
  dVar9 = sin(dVar3);
  dVar10 = sin(dVar5);
  dVar11 = cos(dVar3);
  dVar5 = cos(dVar5);
  fVar14 = (float)(dVar10 * dVar9 * -0.45000001788139343 +
                  dVar5 * (dVar11 * 0.30000001192092896 + 0.5));
  dVar3 = cos(dVar3);
  fVar16 = (float)(dVar3 * 0.75);
  fVar17 = SQRT(fVar16 * fVar16 + fVar13 * fVar13 + fVar14 * fVar14);
  fVar15 = 1.0 / fVar17;
  if (0.0 < fVar17) {
    fVar13 = fVar13 * fVar15;
    fVar14 = fVar14 * fVar15;
  }
  fVar20 = (float)(~-(uint)(0.0 < fVar17) & (uint)fVar16 |
                  (uint)(fVar15 * fVar16) & -(uint)(0.0 < fVar17));
  fVar18 = -fVar13;
  fVar17 = SQRT(fVar14 * fVar14 + fVar13 * fVar13);
  fVar19 = 1.0 / fVar17;
  fVar16 = (float)(-(uint)(0.0 < fVar17) & (uint)(fVar19 * 0.0));
  fVar15 = fVar14;
  if (0.0 < fVar17) {
    fVar15 = fVar14 * fVar19;
    fVar18 = fVar18 * fVar19;
  }
  dVar3 = (double)(fVar1 * 0.1);
  dVar5 = (double)((fVar2 + fVar2) * 3.1415927);
  dVar9 = cos(dVar5);
  dVar10 = sin(dVar5);
  *xyz = (float)((dVar9 * (double)fVar15 + dVar10 * (double)(fVar14 * fVar16 - fVar18 * fVar20)) *
                 dVar3 + (double)(float)(dVar6 * dVar4));
  dVar6 = cos(dVar5);
  dVar9 = sin(dVar5);
  xyz[1] = (float)((dVar6 * (double)fVar18 + dVar9 * (double)(fVar20 * fVar15 - fVar16 * fVar13)) *
                   dVar3 + (double)(float)(dVar7 * dVar4));
  dVar3 = sin(dVar5);
  xyz[2] = (float)(dVar3 * (double)((fVar13 * fVar18 - fVar15 * fVar14) * fVar1 * 0.1) +
                  (double)(float)(dVar8 * 0.5));
  return;
}

Assistant:

static void par_shapes__trefoil(float const* uv, float* xyz, void* userdata)
{
    float minor = *((float*) userdata);
    const float a = 0.5f;
    const float b = 0.3f;
    const float c = 0.5f;
    const float d = minor * 0.1f;
    const float u = (1 - uv[0]) * 4 * PAR_PI;
    const float v = uv[1] * 2 * PAR_PI;
    const float r = a + b * cos(1.5f * u);
    const float x = r * cos(u);
    const float y = r * sin(u);
    const float z = c * sin(1.5f * u);
    float q[3];
    q[0] =
        -1.5f * b * sin(1.5f * u) * cos(u) - (a + b * cos(1.5f * u)) * sin(u);
    q[1] =
        -1.5f * b * sin(1.5f * u) * sin(u) + (a + b * cos(1.5f * u)) * cos(u);
    q[2] = 1.5f * c * cos(1.5f * u);
    par_shapes__normalize3(q);
    float qvn[3] = {q[1], -q[0], 0};
    par_shapes__normalize3(qvn);
    float ww[3];
    par_shapes__cross3(ww, q, qvn);
    xyz[0] = x + d * (qvn[0] * cos(v) + ww[0] * sin(v));
    xyz[1] = y + d * (qvn[1] * cos(v) + ww[1] * sin(v));
    xyz[2] = z + d * ww[2] * sin(v);
}